

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lighting_database.cpp
# Opt level: O1

void LightingDb::prepare_light(GLuint p_shader_id)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  string local_48;
  vec3 local_28;
  
  puVar2 = (undefined8 *)dir_map._16_8_;
  if (prepare_light(unsigned_int)::first == '\0') {
    prepare_light(unsigned_int)::first = '\x01';
    create_dir_light();
    create_point_light(0x100,0x100);
    puVar2 = (undefined8 *)dir_map._16_8_;
  }
  for (; puVar3 = (undefined8 *)point_map._16_8_, puVar2 != (undefined8 *)0x0;
      puVar2 = (undefined8 *)*puVar2) {
    ShaderUtilities::attach_dir_light(p_shader_id,(DirectionalLight *)(puVar2 + 2));
  }
  for (; puVar3 != (undefined8 *)0x0; puVar3 = (undefined8 *)*puVar3) {
    ShaderUtilities::attach_point_light(p_shader_id,(PointLight *)(puVar3 + 2));
  }
  ShaderUtilities::add_spot_light(p_shader_id,(bool)LightingDbWindow::enable_spot_light);
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"far_plane","");
  ShaderUtilities::setFloat(p_shader_id,&local_48,LightingDbWindow::far_plane);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"shadow_bias","");
  ShaderUtilities::setFloat(p_shader_id,&local_48,LightingDbWindow::shadow_bias);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"enable_shadow","");
  ShaderUtilities::setBool(p_shader_id,&local_48,(bool)LightingDbWindow::enable_shadow);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"enable_shadow_debug","");
  ShaderUtilities::setBool(p_shader_id,&local_48,(bool)LightingDbWindow::enable_shadow_debug);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"camera_position","");
  local_28 = AkarinCameraSystem::get_position();
  ShaderUtilities::setVec3(p_shader_id,&local_48,&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void LightingDb::prepare_light(
    const GLuint p_shader_id) noexcept
{
    static bool first = true;
    if (first)
    {
        first = false;
        create_dir_light();
        create_point_light(256, 256);
    }
    for (const auto &dir_light : dir_map)
    {
        ShaderUtilities::attach_dir_light(
            p_shader_id,
            dir_light.second);
    };
    for (const auto &point_light : point_map)
    {
        ShaderUtilities::attach_point_light(
            p_shader_id,
            point_light.second);
    }
    ShaderUtilities::add_spot_light(
        p_shader_id,
        LightingDbWindow::enable_spot_light);

    // TODO :: Move this to PointLight
    ShaderUtilities::setFloat(
        p_shader_id,
        "far_plane",
        LightingDbWindow::far_plane);
    ShaderUtilities::setFloat(
        p_shader_id,
        "shadow_bias",
        LightingDbWindow::shadow_bias);
    ShaderUtilities::setBool(
        p_shader_id,
        "enable_shadow",
        LightingDbWindow::enable_shadow);
    ShaderUtilities::setBool(
        p_shader_id,
        "enable_shadow_debug",
        LightingDbWindow::enable_shadow_debug);
    ShaderUtilities::setVec3(
        p_shader_id,
        "camera_position",
        AkarinCameraSystem::get_position());
}